

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadlock_test.cpp
# Opt level: O2

void __thiscall
CheckedMutexTest_BasicDeadlock_Test<yamc::checked::recursive_mutex>::
~CheckedMutexTest_BasicDeadlock_Test
          (CheckedMutexTest_BasicDeadlock_Test<yamc::checked::recursive_mutex> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, BasicDeadlock)
{
  auto test_body = []{
    yamc::test::barrier step(2);
    TypeParam mtx1;
    TypeParam mtx2;
    yamc::test::task_runner(2, [&](std::size_t id) {
      switch (id) {
      case 0:
        ASSERT_NO_THROW(mtx1.lock());
        step.await();
        EXPECT_NO_THROW(mtx2.lock());
        EXPECT_NO_THROW(mtx2.unlock());
        EXPECT_NO_THROW(mtx1.unlock());
        break;
      case 1:
        ASSERT_NO_THROW(mtx2.lock());
        step.await();
        WAIT_TICKS;
        EXPECT_CHECK_FAILURE_INNER({
          mtx1.lock();
        });
        EXPECT_NO_THROW(mtx2.unlock());
        break;
      }
    });
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}